

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_vectors.h
# Opt level: O0

Bitvec08x16 __thiscall Bitvec08x16::Shuffle(Bitvec08x16 *this,Bitvec08x16 *control)

{
  undefined1 (*in_RDX) [16];
  longlong extraout_RDX;
  undefined1 (*in_RSI) [16];
  Bitvec08x16 *in_RDI;
  Bitvec08x16 BVar1;
  __m128i local_58 [3];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = *(undefined8 *)*in_RSI;
  uStack_10 = *(undefined8 *)(*in_RSI + 8);
  local_28 = *(undefined8 *)*in_RDX;
  uStack_20 = *(undefined8 *)(*in_RDX + 8);
  local_58[0] = (__m128i)vpshufb_avx(*in_RSI,*in_RDX);
  Bitvec08x16(in_RDI,local_58);
  BVar1.vec[1] = extraout_RDX;
  BVar1.vec[0] = (longlong)in_RDI;
  return (Bitvec08x16)BVar1.vec;
}

Assistant:

inline Bitvec08x16 Shuffle(const Bitvec08x16 &control) const {
#ifdef __SSSE3__
        return _mm_shuffle_epi8(vec, control.vec);
#else
        // we'll rely on the assumption that all requested shuffles are for epi16s so each
        // pair of requested bytes are always adjacent like 0x0302.
        __m128i ctrl = control.vec & _mm_set1_epi16(0xf);

        // replicate low 16 bits of each epi32 to the high 16
        Bitvec08x16 lo16s = vec & _mm_set1_epi32(0x0000ffff);
        lo16s |= _mm_bslli_si128(lo16s.vec, 2);
        // and vice versa
        Bitvec08x16 hi16s = vec & _mm_set1_epi32(0xffff0000);
        hi16s |= _mm_bsrli_si128(hi16s.vec, 2);

        Bitvec08x16 z{};
        z |= _mm_shuffle_epi32(lo16s.vec, 0b00000000) & _mm_cmpeq_epi16(ctrl, _mm_set1_epi16(0x0));
        z |= _mm_shuffle_epi32(hi16s.vec, 0b00000000) & _mm_cmpeq_epi16(ctrl, _mm_set1_epi16(0x2));
        z |= _mm_shuffle_epi32(lo16s.vec, 0b01010101) & _mm_cmpeq_epi16(ctrl, _mm_set1_epi16(0x4));
        z |= _mm_shuffle_epi32(hi16s.vec, 0b01010101) & _mm_cmpeq_epi16(ctrl, _mm_set1_epi16(0x6));
        z |= _mm_shuffle_epi32(lo16s.vec, 0b10101010) & _mm_cmpeq_epi16(ctrl, _mm_set1_epi16(0x8));
        z |= _mm_shuffle_epi32(hi16s.vec, 0b10101010) & _mm_cmpeq_epi16(ctrl, _mm_set1_epi16(0xa));
        z |= _mm_shuffle_epi32(lo16s.vec, 0b11111111) & _mm_cmpeq_epi16(ctrl, _mm_set1_epi16(0xc));
        z |= _mm_shuffle_epi32(hi16s.vec, 0b11111111) & _mm_cmpeq_epi16(ctrl, _mm_set1_epi16(0xe));
        return z;
#endif
    }